

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttribute<tinyusdz::Animatable<std::array<float,_2UL>_>_>::~TypedAttribute
          (TypedAttribute<tinyusdz::Animatable<std::array<float,_2UL>_>_> *this)

{
  TypedAttribute<tinyusdz::Animatable<std::array<float,_2UL>_>_> *this_local;
  
  nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_2UL>_>_>::~optional
            (&this->_attrib);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  AttrMetas::~AttrMetas(&this->_metas);
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }